

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::EnforceUniqueDir(cmMakefile *this,string *srcPath,string *binPath)

{
  PolicyStatus PVar1;
  ostream *poVar2;
  PolicyID id;
  bool bVar3;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  pVar4 = std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->GlobalGenerator->BinaryDirectories,binPath);
  bVar3 = true;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    PVar1 = cmState::Snapshot::GetPolicy(&this->StateSnapshot,CMP0013);
    bVar3 = true;
    switch(PVar1) {
    case OLD:
      break;
    case WARN:
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0xd,id);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"The binary directory\n",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(binPath->_M_dataplus)._M_p,binPath->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"is already used to build a source directory.  ",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"This command uses it to build source directory\n",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(srcPath->_M_dataplus)._M_p,srcPath->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"which can generate conflicting build files.  ",0x2d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"CMake does not support this use case but it used ",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"to work accidentally and is being allowed for ",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"compatibility.",0xe);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1c0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1c0,(cmPolicies *)0xd,id);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
    case NEW:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"The binary directory\n",0x15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"  ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(binPath->_M_dataplus)._M_p,binPath->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"is already used to build a source directory.  ",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"It cannot be used to build source directory\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(srcPath->_M_dataplus)._M_p,srcPath->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"Specify a unique binary directory name.",0x27);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_1c0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
    default:
      bVar3 = false;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  }
  return bVar3;
}

Assistant:

bool cmMakefile::EnforceUniqueDir(const std::string& srcPath,
                                  const std::string& binPath) const
{
  // Make sure the binary directory is unique.
  cmGlobalGenerator* gg = this->GetGlobalGenerator();
  if(gg->BinaryDirectoryIsNew(binPath))
    {
    return true;
    }
  std::ostringstream e;
  switch (this->GetPolicyStatus(cmPolicies::CMP0013))
    {
    case cmPolicies::WARN:
      // Print the warning.
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0013)
        << "\n"
        << "The binary directory\n"
        << "  " << binPath << "\n"
        << "is already used to build a source directory.  "
        << "This command uses it to build source directory\n"
        << "  " << srcPath << "\n"
        << "which can generate conflicting build files.  "
        << "CMake does not support this use case but it used "
        << "to work accidentally and is being allowed for "
        << "compatibility.";
      this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
    case cmPolicies::OLD:
      // OLD behavior does not warn.
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0013)
        << "\n";
    case cmPolicies::NEW:
      // NEW behavior prints the error.
      e << "The binary directory\n"
        << "  " << binPath << "\n"
        << "is already used to build a source directory.  "
        << "It cannot be used to build source directory\n"
        << "  " << srcPath << "\n"
        << "Specify a unique binary directory name.";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      break;
    }

  return false;
}